

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

iterator __thiscall
llvm::SmallVectorImpl<char>::insert<unsigned_char_const*,void>
          (SmallVectorImpl<char> *this,iterator I,uchar *From,uchar *To)

{
  move_iterator<char_*> in_end;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong __n;
  size_t __n_00;
  iterator pcVar4;
  ulong uVar5;
  ulong uVar6;
  iterator __src;
  uchar *puVar7;
  
  pcVar4 = (iterator)
           (this->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  uVar5 = (long)I - (long)pcVar4;
  uVar2 = (ulong)(this->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  if (pcVar4 + uVar2 == I) {
    append<unsigned_char_const*,void>(this,From,To);
    __src = (iterator)
            (uVar5 + (long)(this->super_SmallVectorTemplateBase<char,_true>).
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX)
    ;
  }
  else {
    if (I < pcVar4) {
      __assert_fail("I >= this->begin() && \"Insertion iterator is out of bounds.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x259,
                    "iterator llvm::SmallVectorImpl<char>::insert(iterator, ItTy, ItTy) [T = char, ItTy = const unsigned char *]"
                   );
    }
    if (pcVar4 + uVar2 < I) {
      __assert_fail("I <= this->end() && \"Inserting past the end of the vector.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x25a,
                    "iterator llvm::SmallVectorImpl<char>::insert(iterator, ItTy, ItTy) [T = char, ItTy = const unsigned char *]"
                   );
    }
    uVar6 = (long)To - (long)From;
    if ((ulong)(this->super_SmallVectorTemplateBase<char,_true>).
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity <
        uVar6 + uVar2) {
      SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,uVar6 + uVar2,1);
      pcVar4 = (iterator)
               (this->super_SmallVectorTemplateBase<char,_true>).
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      uVar2 = (ulong)(this->super_SmallVectorTemplateBase<char,_true>).
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    }
    __src = pcVar4 + uVar5;
    in_end._M_current = pcVar4 + uVar2;
    __n = uVar2 - uVar5;
    if (__n < uVar6) {
      uVar1 = uVar6 + uVar2;
      if ((this->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar1) {
        __assert_fail("Size <= capacity()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
      }
      (this->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Size = (uint)uVar1;
      if (uVar2 != uVar5) {
        memcpy(pcVar4 + (uVar1 - __n),__src,__n);
      }
      if (__n != 0) {
        uVar2 = 0;
        do {
          __src[uVar2] = From[uVar2];
          uVar2 = uVar2 + 1;
        } while (__n != uVar2);
        uVar6 = uVar6 - uVar2;
        From = From + uVar2;
      }
      if (0 < (long)uVar6) {
        uVar6 = uVar6 + 1;
        lVar3 = 0;
        do {
          in_end._M_current[lVar3] = From[lVar3];
          uVar6 = uVar6 - 1;
          lVar3 = lVar3 + 1;
        } while (1 < uVar6);
      }
    }
    else {
      append<std::move_iterator<char*>,void>
                (this,(move_iterator<char_*>)(in_end._M_current + -uVar6),in_end);
      __n_00 = (long)(in_end._M_current + -uVar6) - (long)__src;
      if (__n_00 != 0) {
        memmove(in_end._M_current + -__n_00,__src,__n_00);
      }
      if (0 < (long)uVar6) {
        puVar7 = To + (1 - (long)From);
        lVar3 = 0;
        do {
          __src[lVar3] = From[lVar3];
          puVar7 = puVar7 + -1;
          lVar3 = lVar3 + 1;
        } while ((uchar *)0x1 < puVar7);
      }
    }
  }
  return __src;
}

Assistant:

iterator insert(iterator I, ItTy From, ItTy To) {
    // Convert iterator to elt# to avoid invalidating iterator when we reserve()
    size_t InsertElt = I - this->begin();

    if (I == this->end()) {  // Important special case for empty vector.
      append(From, To);
      return this->begin()+InsertElt;
    }

    assert(I >= this->begin() && "Insertion iterator is out of bounds.");
    assert(I <= this->end() && "Inserting past the end of the vector.");

    size_t NumToInsert = std::distance(From, To);

    // Ensure there is enough space.
    reserve(this->size() + NumToInsert);

    // Uninvalidate the iterator.
    I = this->begin()+InsertElt;

    // If there are more elements between the insertion point and the end of the
    // range than there are being inserted, we can use a simple approach to
    // insertion.  Since we already reserved space, we know that this won't
    // reallocate the vector.
    if (size_t(this->end()-I) >= NumToInsert) {
      T *OldEnd = this->end();
      append(std::move_iterator<iterator>(this->end() - NumToInsert),
             std::move_iterator<iterator>(this->end()));

      // Copy the existing elements that get replaced.
      std::move_backward(I, OldEnd-NumToInsert, OldEnd);

      std::copy(From, To, I);
      return I;
    }

    // Otherwise, we're inserting more elements than exist already, and we're
    // not inserting at the end.

    // Move over the elements that we're about to overwrite.
    T *OldEnd = this->end();
    this->set_size(this->size() + NumToInsert);
    size_t NumOverwritten = OldEnd-I;
    this->uninitialized_move(I, OldEnd, this->end()-NumOverwritten);

    // Replace the overwritten part.
    for (T *J = I; NumOverwritten > 0; --NumOverwritten) {
      *J = *From;
      ++J; ++From;
    }

    // Insert the non-overwritten middle part.
    this->uninitialized_copy(From, To, OldEnd);
    return I;
  }